

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

CommonDebugInfoInstructions __thiscall
spvtools::opt::Instruction::GetCommonDebugOpcode(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  FeatureManager *pFVar6;
  uint32_t used_set_id;
  uint32_t shader_set_id;
  uint32_t opencl_set_id;
  Instruction *this_local;
  
  OVar1 = opcode(this);
  if (OVar1 == OpExtInst) {
    pIVar5 = context(this);
    pFVar6 = IRContext::get_feature_mgr(pIVar5);
    uVar2 = FeatureManager::GetExtInstImportId_OpenCL100DebugInfo(pFVar6);
    pIVar5 = context(this);
    pFVar6 = IRContext::get_feature_mgr(pIVar5);
    uVar3 = FeatureManager::GetExtInstImportId_Shader100DebugInfo(pFVar6);
    if ((uVar2 == 0) && (uVar3 == 0)) {
      this_local._4_4_ = CommonDebugInfoInstructionsMax;
    }
    else {
      uVar4 = GetSingleWordInOperand(this,0);
      if ((uVar4 == uVar2) || (uVar4 == uVar3)) {
        this_local._4_4_ = GetSingleWordInOperand(this,1);
      }
      else {
        this_local._4_4_ = CommonDebugInfoInstructionsMax;
      }
    }
  }
  else {
    this_local._4_4_ = CommonDebugInfoInstructionsMax;
  }
  return this_local._4_4_;
}

Assistant:

CommonDebugInfoInstructions Instruction::GetCommonDebugOpcode() const {
  if (opcode() != spv::Op::OpExtInst) {
    return CommonDebugInfoInstructionsMax;
  }

  const uint32_t opencl_set_id =
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo();
  const uint32_t shader_set_id =
      context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo();

  if (!opencl_set_id && !shader_set_id) {
    return CommonDebugInfoInstructionsMax;
  }

  const uint32_t used_set_id = GetSingleWordInOperand(kExtInstSetIdInIdx);

  if (used_set_id != opencl_set_id && used_set_id != shader_set_id) {
    return CommonDebugInfoInstructionsMax;
  }

  return CommonDebugInfoInstructions(
      GetSingleWordInOperand(kExtInstInstructionInIdx));
}